

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O3

bool cmsys::SystemTools::TextFilesDiffer(string *path1,string *path2)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  string line2;
  string line1;
  ifstream if2;
  ifstream if1;
  string local_480;
  string local_460;
  long local_440 [4];
  byte abStack_420 [488];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::ifstream::ifstream(local_238,(path1->_M_dataplus)._M_p,_S_in);
  std::ifstream::ifstream(local_440,(path2->_M_dataplus)._M_p,_S_in);
  bVar4 = true;
  if (((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) == 0) &&
     ((abStack_420[*(long *)(local_440[0] + -0x18)] & 5) == 0)) {
    do {
      local_460._M_string_length = 0;
      local_460.field_2._M_local_buf[0] = '\0';
      local_480._M_string_length = 0;
      local_480.field_2._M_local_buf[0] = '\0';
      local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
      local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
      bVar1 = GetLineFromStream((istream *)local_238,&local_460,(bool *)0x0,-1);
      bVar2 = GetLineFromStream((istream *)local_440,&local_480,(bool *)0x0,-1);
      if (bVar1 && bVar2) {
        if (local_460._M_string_length == local_480._M_string_length) {
          iVar5 = 0;
          if (local_460._M_string_length != 0) {
            iVar3 = bcmp(local_460._M_dataplus._M_p,local_480._M_dataplus._M_p,
                         local_460._M_string_length);
            iVar5 = 0;
            if (iVar3 != 0) goto LAB_003ea38f;
          }
        }
        else {
LAB_003ea38f:
          iVar5 = 1;
        }
      }
      else {
        iVar5 = 2 - (uint)(bVar1 != bVar2);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_480._M_dataplus._M_p != &local_480.field_2) {
        operator_delete(local_480._M_dataplus._M_p,
                        CONCAT71(local_480.field_2._M_allocated_capacity._1_7_,
                                 local_480.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_460._M_dataplus._M_p != &local_460.field_2) {
        operator_delete(local_460._M_dataplus._M_p,
                        CONCAT71(local_460.field_2._M_allocated_capacity._1_7_,
                                 local_460.field_2._M_local_buf[0]) + 1);
      }
    } while (iVar5 == 0);
    if (iVar5 == 2) {
      bVar4 = false;
    }
  }
  std::ifstream::~ifstream(local_440);
  std::ifstream::~ifstream(local_238);
  return bVar4;
}

Assistant:

bool SystemTools::TextFilesDiffer(const std::string& path1,
                                  const std::string& path2)
{
  kwsys::ifstream if1(path1.c_str());
  kwsys::ifstream if2(path2.c_str());
  if (!if1 || !if2) {
    return true;
  }

  for (;;) {
    std::string line1, line2;
    bool hasData1 = GetLineFromStream(if1, line1);
    bool hasData2 = GetLineFromStream(if2, line2);
    if (hasData1 != hasData2) {
      return true;
    }
    if (!hasData1) {
      break;
    }
    if (line1 != line2) {
      return true;
    }
  }
  return false;
}